

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O0

void __thiscall antlr::CommonAST::initialize(CommonAST *this,RefAST *t)

{
  int iVar1;
  AST *pAVar2;
  ASTRefCount<antlr::AST> *in_RSI;
  long *in_RDI;
  string local_30 [48];
  
  pAVar2 = ASTRefCount<antlr::AST>::operator->(in_RSI);
  iVar1 = (*pAVar2->_vptr_AST[0x10])();
  (**(code **)(*in_RDI + 0xb8))(in_RDI,iVar1);
  pAVar2 = ASTRefCount<antlr::AST>::operator->(in_RSI);
  (*pAVar2->_vptr_AST[0xf])();
  (**(code **)(*in_RDI + 0xb0))(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void initialize( RefAST t )
	{
		setType(t->getType());
		setText(t->getText());
	}